

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenReadFunctionCall
          (InstrumentPass *this,uint32_t return_id,uint32_t func_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *func_call_args,
          InstructionBuilder *ref_builder)

{
  Analysis preserved_analyses;
  uint32_t uVar1;
  mapped_type *pmVar2;
  IRContext *context;
  Instruction *pIVar3;
  bool local_99;
  undefined1 auStack_88 [4];
  uint32_t res_id;
  undefined1 local_78 [16];
  Instruction *insert_before;
  undefined1 local_60 [7];
  bool insert_in_first_block;
  undefined1 local_58 [8];
  InstructionBuilder builder;
  uint32_t res_id_1;
  InstructionBuilder *ref_builder_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *func_call_args_local;
  uint32_t func_id_local;
  uint32_t return_id_local;
  InstrumentPass *this_local;
  
  if ((this->opt_direct_reads_ & 1U) != 0) {
    pmVar2 = std::
             unordered_map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int,_spvtools::opt::InstrumentPass::vector_hash_,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
             ::operator[](&this->call2id_,func_call_args);
    if (*pmVar2 != 0) {
      return *pmVar2;
    }
    builder._28_4_ = 0;
  }
  context = InstructionBuilder::GetContext(ref_builder);
  InstructionBuilder::GetInsertPoint((InstructionBuilder *)local_60);
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)local_60);
  preserved_analyses = InstructionBuilder::GetPreservedAnalysis(ref_builder);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_58,context,pIVar3,preserved_analyses);
  local_99 = false;
  if ((this->opt_direct_reads_ & 1U) != 0) {
    local_99 = AllConstant(this,func_call_args);
  }
  insert_before._7_1_ = local_99;
  if (local_99 != false) {
    _auStack_88 = Function::begin(this->curr_func_);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)auStack_88);
    BasicBlock::tail((BasicBlock *)local_78);
    local_78._8_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)local_78);
    InstructionBuilder::SetInsertPoint((InstructionBuilder *)local_58,(Instruction *)local_78._8_8_)
    ;
  }
  pIVar3 = InstructionBuilder::AddFunctionCall
                     ((InstructionBuilder *)local_58,return_id,func_id,func_call_args);
  uVar1 = Instruction::result_id(pIVar3);
  if ((insert_before._7_1_ & 1) != 0) {
    pmVar2 = std::
             unordered_map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int,_spvtools::opt::InstrumentPass::vector_hash_,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
             ::operator[](&this->call2id_,func_call_args);
    *pmVar2 = uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t InstrumentPass::GenReadFunctionCall(
    uint32_t return_id, uint32_t func_id,
    const std::vector<uint32_t>& func_call_args,
    InstructionBuilder* ref_builder) {
  // If optimizing direct reads and the call has already been generated,
  // use its result
  if (opt_direct_reads_) {
    uint32_t res_id = call2id_[func_call_args];
    if (res_id != 0) return res_id;
  }
  // If the function arguments are all constants, the call can be moved to the
  // first block of the function where its result can be reused. One example
  // where this is profitable is for uniform buffer references, of which there
  // are often many.
  InstructionBuilder builder(ref_builder->GetContext(),
                             &*ref_builder->GetInsertPoint(),
                             ref_builder->GetPreservedAnalysis());
  bool insert_in_first_block = opt_direct_reads_ && AllConstant(func_call_args);
  if (insert_in_first_block) {
    Instruction* insert_before = &*curr_func_->begin()->tail();
    builder.SetInsertPoint(insert_before);
  }
  uint32_t res_id =
      builder.AddFunctionCall(return_id, func_id, func_call_args)->result_id();
  if (insert_in_first_block) call2id_[func_call_args] = res_id;
  return res_id;
}